

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall json::JSON::~JSON(JSON *this)

{
  Class CVar1;
  string *this_00;
  ulong uStack_10;
  
  CVar1 = this->Type;
  if (CVar1 == Object) {
    this_00 = (string *)(this->Internal).List;
    if (this_00 != (string *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
                   *)this_00);
    }
    uStack_10 = 0x30;
  }
  else if (CVar1 == String) {
    this_00 = (string *)(this->Internal).List;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
    }
    uStack_10 = 0x20;
  }
  else {
    if (CVar1 != Array) {
      return;
    }
    this_00 = (string *)(this->Internal).List;
    if (this_00 != (string *)0x0) {
      std::deque<json::JSON,_std::allocator<json::JSON>_>::~deque
                ((deque<json::JSON,_std::allocator<json::JSON>_> *)this_00);
    }
    uStack_10 = 0x50;
  }
  operator_delete(this_00,uStack_10);
  return;
}

Assistant:

~JSON() {
            switch( Type ) {
            case Class::Array:
                delete Internal.List;
                break;
            case Class::Object:
                delete Internal.Map;
                break;
            case Class::String:
                delete Internal.String;
                break;
            default:;
            }
        }